

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  unsigned_short *puVar6;
  uint *puVar7;
  float *pfVar8;
  uint *puVar9;
  results *in_RDX;
  vec3F *this_00;
  uint i_1;
  vec3F fc;
  color_quad_u8 *c;
  uint i;
  vec3F avg_color;
  uint n;
  undefined1 in_stack_00001457;
  uint in_stack_00001458;
  uint in_stack_0000145c;
  unsigned_short *in_stack_00001460;
  uint *in_stack_00001468;
  uint *in_stack_00001470;
  uint in_stack_0000147c;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  etc1_solution_coordinates *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6b;
  uint in_stack_ffffffffffffff6c;
  vector<unsigned_int> *in_stack_ffffffffffffff70;
  uint local_48;
  vec<3U,_float> local_44;
  color_quad_u8 *local_38;
  uint local_2c;
  vec<3U,_float> local_28;
  uint local_1c;
  EVP_PKEY_CTX *local_10;
  etc1_optimizer *local_8;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  local_1c = this->m_pParams->m_num_src_pixels;
  local_10 = ctx;
  local_8 = this;
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  iVar5 = 0x1f;
  if ((this->m_pParams->m_use_color4 & 1U) != 0) {
    iVar5 = 0xf;
  }
  this->m_limit = iVar5;
  vec<3U,_float>::vec((vec<3U,_float> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  vector<unsigned_short>::resize
            ((vector<unsigned_short> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  vector<unsigned_int>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(bool)in_stack_ffffffffffffff6b);
  vector<unsigned_int>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(bool)in_stack_ffffffffffffff6b);
  for (local_2c = 0; local_2c < local_1c; local_2c = local_2c + 1) {
    local_38 = this->m_pParams->m_pSrc_pixels + local_2c;
    vec<3U,_float>::vec((vec<3U,_float> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,0.0);
    vec<3U,_float>::operator+=(&local_28,&local_44);
    bVar1 = (local_38->field_0).field_0.r;
    bVar2 = (local_38->field_0).field_0.g;
    bVar3 = (local_38->field_0).field_0.b;
    puVar6 = vector<unsigned_short>::operator[](&this->m_luma,local_2c);
    uVar4 = local_2c;
    *puVar6 = (ushort)bVar1 + (ushort)bVar2 + (ushort)bVar3;
    puVar7 = vector<unsigned_int>::operator[](this->m_sorted_luma,local_2c);
    *puVar7 = uVar4;
  }
  vec<3U,_float>::operator/=(&local_28,(float)local_1c);
  this_00 = &this->m_avg_color;
  vec<3U,_float>::operator=(this_00,&local_28);
  pfVar8 = vec<3U,_float>::operator[](this_00,0);
  iVar5 = math::clamp<int>((int)(long)((*pfVar8 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  this->m_br = iVar5;
  pfVar8 = vec<3U,_float>::operator[](this_00,1);
  iVar5 = math::clamp<int>((int)(long)((*pfVar8 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  this->m_bg = iVar5;
  pfVar8 = vec<3U,_float>::operator[](this_00,2);
  iVar5 = math::clamp<int>((int)(long)((*pfVar8 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  this->m_bb = iVar5;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    vector<unsigned_int>::get_ptr(this->m_sorted_luma + 1);
    vector<unsigned_short>::get_ptr(&this->m_luma);
    puVar7 = indirect_radix_sort<unsigned_int,unsigned_short>
                       (in_stack_0000147c,in_stack_00001470,in_stack_00001468,in_stack_00001460,
                        in_stack_0000145c,in_stack_00001458,(bool)in_stack_00001457);
    this->m_pSorted_luma_indices = puVar7;
    puVar7 = vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    this->m_pSorted_luma = puVar7;
    puVar7 = this->m_pSorted_luma_indices;
    puVar9 = vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    if (puVar7 == puVar9) {
      puVar7 = vector<unsigned_int>::get_ptr(this->m_sorted_luma + 1);
      this->m_pSorted_luma = puVar7;
    }
    for (local_48 = 0; local_48 < local_1c; local_48 = local_48 + 1) {
      puVar6 = vector<unsigned_short>::operator[]
                         (&this->m_luma,this->m_pSorted_luma_indices[local_48]);
      this->m_pSorted_luma[local_48] = (uint)*puVar6;
    }
  }
  etc1_solution_coordinates::clear(in_stack_ffffffffffffff60);
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return (int)this;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result) {
  m_pParams = &params;
  m_pResult = &result;

  const uint n = m_pParams->m_num_src_pixels;

  m_selectors.resize(n);
  m_best_selectors.resize(n);
  m_temp_selectors.resize(n);
  m_trial_solution.m_selectors.resize(n);
  m_best_solution.m_selectors.resize(n);

  m_limit = m_pParams->m_use_color4 ? 15 : 31;

  vec3F avg_color(0.0f);

  m_luma.resize(n);
  m_sorted_luma[0].resize(n);
  m_sorted_luma[1].resize(n);

  for (uint i = 0; i < n; i++) {
    const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
    const vec3F fc(c.r, c.g, c.b);

    avg_color += fc;

    m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
    m_sorted_luma[0][i] = i;
  }
  avg_color /= static_cast<float>(n);
  m_avg_color = avg_color;

  m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
  m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

  if (m_pParams->m_quality <= cCRNETCQualityMedium) {
    m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
    m_pSorted_luma = m_sorted_luma[0].get_ptr();
    if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
      m_pSorted_luma = m_sorted_luma[1].get_ptr();

    for (uint i = 0; i < n; i++)
      m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
  }

  m_best_solution.m_coords.clear();
  m_best_solution.m_valid = false;
  m_best_solution.m_error = cUINT64_MAX;
}